

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilderCmd.cpp
# Opt level: O2

void write_into_file(FILE *outfile,char *opt,char *arg,char **values)

{
  uint uVar1;
  
  if (arg == (char *)0x0) {
    fprintf((FILE *)outfile,"%s\n",opt);
    return;
  }
  if (values != (char **)0x0) {
    uVar1 = check_possible_values(arg,values);
    if (-1 < (int)uVar1) {
      fprintf((FILE *)outfile,"%s=\"%s\" # %s\n",opt,arg,values[uVar1]);
      return;
    }
  }
  fprintf((FILE *)outfile,"%s=\"%s\"\n",opt,arg);
  return;
}

Assistant:

static void
write_into_file(FILE *outfile, const char *opt, const char *arg, const char *values[])
{
  int found = -1;
  if (arg) {
    if (values) {
      found = check_possible_values(arg, values);      
    }
    if (found >= 0)
      fprintf(outfile, "%s=\"%s\" # %s\n", opt, arg, values[found]);
    else
      fprintf(outfile, "%s=\"%s\"\n", opt, arg);
  } else {
    fprintf(outfile, "%s\n", opt);
  }
}